

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsortfilterproxymodel.cpp
# Opt level: O0

void QSortFilterProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  CaseSensitivity CVar4;
  QString *pattern;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QBindable<QRegularExpression> QVar5;
  QBindable<Qt::CaseSensitivity> QVar6;
  QBindable<int> QVar7;
  QBindable<bool> QVar8;
  void *_v_1;
  void *_v;
  QSortFilterProxyModel *_t;
  undefined4 in_stack_fffffffffffffe78;
  CaseSensitivity in_stack_fffffffffffffe7c;
  QSortFilterProxyModel *in_stack_fffffffffffffe80;
  QSortFilterProxyModel *in_stack_fffffffffffffe88;
  QSortFilterProxyModel *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  int column;
  QSortFilterProxyModel *in_stack_fffffffffffffea0;
  QSortFilterProxyModel *in_stack_fffffffffffffea8;
  CaseSensitivity *pCVar9;
  QString *in_stack_fffffffffffffec0;
  QSortFilterProxyModel *in_stack_fffffffffffffec8;
  QString *in_stack_fffffffffffffed0;
  QSortFilterProxyModel *in_stack_fffffffffffffed8;
  CaseSensitivity cs;
  code *in_stack_fffffffffffffee0;
  QRegularExpression *in_stack_fffffffffffffee8;
  code *in_stack_fffffffffffffef0;
  QUntypedPropertyData *local_b0;
  QBindableInterface *local_a8;
  QUntypedPropertyData *local_a0;
  QBindableInterface *local_98;
  QUntypedPropertyData *local_90;
  QBindableInterface *local_88;
  QUntypedPropertyData *local_80;
  QBindableInterface *local_78;
  QUntypedPropertyData *local_70;
  QBindableInterface *local_68;
  QUntypedPropertyData *local_60;
  QBindableInterface *local_58;
  QUntypedPropertyData *local_50;
  QBindableInterface *local_48;
  QUntypedPropertyData *local_40;
  QBindableInterface *local_38;
  QUntypedPropertyData *local_30;
  QBindableInterface *local_28;
  QUntypedPropertyData *local_20;
  QBindableInterface *local_18;
  
  column = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    pattern = (QString *)(ulong)in_EDX;
    bVar3 = SUB41(in_stack_fffffffffffffe7c >> 0x18,0);
    switch(pattern) {
    case (QString *)0x0:
      dynamicSortFilterChanged((QSortFilterProxyModel *)0x87ace4,bVar3);
      break;
    case (QString *)0x1:
      filterCaseSensitivityChanged((QSortFilterProxyModel *)0x87ad04,in_stack_fffffffffffffe7c);
      break;
    case (QString *)0x2:
      sortCaseSensitivityChanged((QSortFilterProxyModel *)0x87ad24,in_stack_fffffffffffffe7c);
      break;
    case (QString *)0x3:
      sortLocaleAwareChanged((QSortFilterProxyModel *)0x87ad49,bVar3);
      break;
    case (QString *)0x4:
      sortRoleChanged((QSortFilterProxyModel *)0x87ad69,in_stack_fffffffffffffe7c);
      break;
    case (QString *)0x5:
      filterRoleChanged((QSortFilterProxyModel *)0x87ad89,in_stack_fffffffffffffe7c);
      break;
    case (QString *)0x6:
      recursiveFilteringEnabledChanged((QSortFilterProxyModel *)0x87adae,bVar3);
      break;
    case (QString *)0x7:
      autoAcceptChildRowsChanged((QSortFilterProxyModel *)0x87add3,bVar3);
      break;
    case (QString *)0x8:
      setFilterRegularExpression(in_stack_fffffffffffffea0,pattern);
      break;
    case (QString *)0x9:
      setFilterRegularExpression
                ((QSortFilterProxyModel *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      break;
    case (QString *)0xa:
      setFilterWildcard(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      break;
    case (QString *)0xb:
      setFilterFixedString(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      break;
    case (QString *)0xc:
      invalidate(in_stack_fffffffffffffea8);
    }
    column = (int)((ulong)pattern >> 0x20);
  }
  cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (in_ESI == 5) {
    bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                      (in_RCX,(void **)dynamicSortFilterChanged,0,0);
    if (((bVar3) ||
        (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(Qt::CaseSensitivity)>
                           (in_RCX,(void **)filterCaseSensitivityChanged,0,1), bVar3)) ||
       (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(Qt::CaseSensitivity)>
                          (in_RCX,(void **)sortCaseSensitivityChanged,0,2), bVar3))
    goto switchD_0087b361_default;
    in_stack_fffffffffffffef0 = sortLocaleAwareChanged;
    bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                      (in_RCX,(void **)sortLocaleAwareChanged,0,3);
    if (bVar3) goto switchD_0087b361_default;
    in_stack_fffffffffffffee0 = sortRoleChanged;
    in_stack_fffffffffffffee8 = (QRegularExpression *)0x0;
    bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(int)>
                      (in_RCX,(void **)sortRoleChanged,0,4);
    if (bVar3) goto switchD_0087b361_default;
    cs = CaseInsensitive;
    bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(int)>
                      (in_RCX,(void **)filterRoleChanged,0,5);
    if (((bVar3) ||
        (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                           (in_RCX,(void **)recursiveFilteringEnabledChanged,0,6), bVar3)) ||
       (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                          (in_RCX,(void **)autoAcceptChildRowsChanged,0,7), bVar3))
    goto switchD_0087b361_default;
  }
  if (in_ESI == 1) {
    pCVar9 = *(CaseSensitivity **)in_RCX;
    in_stack_fffffffffffffe90 = (QSortFilterProxyModel *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffe90) {
    case (QSortFilterProxyModel *)0x0:
      filterRegularExpression(in_stack_fffffffffffffe88);
      QRegularExpression::operator=
                ((QRegularExpression *)in_stack_fffffffffffffe80,
                 (QRegularExpression *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                );
      QRegularExpression::~QRegularExpression((QRegularExpression *)0x87b0e9);
      break;
    case (QSortFilterProxyModel *)0x1:
      CVar4 = filterKeyColumn(in_stack_fffffffffffffe80);
      *pCVar9 = CVar4;
      break;
    case (QSortFilterProxyModel *)0x2:
      bVar3 = dynamicSortFilter(in_stack_fffffffffffffe80);
      *(bool *)pCVar9 = bVar3;
      break;
    case (QSortFilterProxyModel *)0x3:
      CVar4 = filterCaseSensitivity(in_stack_fffffffffffffe80);
      *pCVar9 = CVar4;
      break;
    case (QSortFilterProxyModel *)0x4:
      CVar4 = sortCaseSensitivity(in_stack_fffffffffffffe80);
      *pCVar9 = CVar4;
      break;
    case (QSortFilterProxyModel *)0x5:
      bVar3 = isSortLocaleAware(in_stack_fffffffffffffe80);
      *(bool *)pCVar9 = bVar3;
      break;
    case (QSortFilterProxyModel *)0x6:
      CVar4 = sortRole(in_stack_fffffffffffffe80);
      *pCVar9 = CVar4;
      break;
    case (QSortFilterProxyModel *)0x7:
      CVar4 = filterRole(in_stack_fffffffffffffe80);
      *pCVar9 = CVar4;
      break;
    case (QSortFilterProxyModel *)0x8:
      bVar3 = isRecursiveFilteringEnabled(in_stack_fffffffffffffe80);
      *(bool *)pCVar9 = bVar3;
      break;
    case (QSortFilterProxyModel *)0x9:
      bVar3 = autoAcceptChildRows(in_stack_fffffffffffffe80);
      *(bool *)pCVar9 = bVar3;
    }
  }
  if (in_ESI == 2) {
    in_stack_fffffffffffffe88 = (QSortFilterProxyModel *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffe88) {
    case (QSortFilterProxyModel *)0x0:
      setFilterRegularExpression
                ((QSortFilterProxyModel *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      break;
    case (QSortFilterProxyModel *)0x1:
      setFilterKeyColumn(*(QSortFilterProxyModel **)in_RCX,column);
      break;
    case (QSortFilterProxyModel *)0x2:
      setDynamicSortFilter(in_stack_fffffffffffffe90,false);
      break;
    case (QSortFilterProxyModel *)0x3:
      setFilterCaseSensitivity((QSortFilterProxyModel *)in_stack_fffffffffffffee0,cs);
      break;
    case (QSortFilterProxyModel *)0x4:
      setSortCaseSensitivity(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      break;
    case (QSortFilterProxyModel *)0x5:
      setSortLocaleAware(in_stack_fffffffffffffe80,SUB41(in_stack_fffffffffffffe7c >> 0x18,0));
      break;
    case (QSortFilterProxyModel *)0x6:
      setSortRole(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      break;
    case (QSortFilterProxyModel *)0x7:
      setFilterRole(in_stack_fffffffffffffe90,0);
      break;
    case (QSortFilterProxyModel *)0x8:
      setRecursiveFilteringEnabled(in_stack_fffffffffffffe90,false);
      break;
    case (QSortFilterProxyModel *)0x9:
      setAutoAcceptChildRows(in_stack_fffffffffffffe90,false);
    }
  }
  if (in_ESI == 8) {
    switch(in_EDX) {
    case 0:
      QVar5 = bindableFilterRegularExpression(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_20 = QVar5.super_QUntypedBindable.data;
      *puVar2 = local_20;
      local_18 = QVar5.super_QUntypedBindable.iface;
      puVar2[1] = local_18;
      break;
    case 1:
      QVar7 = bindableFilterKeyColumn(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_30 = QVar7.super_QUntypedBindable.data;
      *puVar2 = local_30;
      local_28 = QVar7.super_QUntypedBindable.iface;
      puVar2[1] = local_28;
      break;
    case 2:
      QVar8 = bindableDynamicSortFilter(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_40 = QVar8.super_QUntypedBindable.data;
      *puVar2 = local_40;
      local_38 = QVar8.super_QUntypedBindable.iface;
      puVar2[1] = local_38;
      break;
    case 3:
      QVar6 = bindableFilterCaseSensitivity(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_50 = QVar6.super_QUntypedBindable.data;
      *puVar2 = local_50;
      local_48 = QVar6.super_QUntypedBindable.iface;
      puVar2[1] = local_48;
      break;
    case 4:
      QVar6 = bindableSortCaseSensitivity(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_60 = QVar6.super_QUntypedBindable.data;
      *puVar2 = local_60;
      local_58 = QVar6.super_QUntypedBindable.iface;
      puVar2[1] = local_58;
      break;
    case 5:
      QVar8 = bindableIsSortLocaleAware(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_70 = QVar8.super_QUntypedBindable.data;
      *puVar2 = local_70;
      local_68 = QVar8.super_QUntypedBindable.iface;
      puVar2[1] = local_68;
      break;
    case 6:
      QVar7 = bindableSortRole(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_80 = QVar7.super_QUntypedBindable.data;
      *puVar2 = local_80;
      local_78 = QVar7.super_QUntypedBindable.iface;
      puVar2[1] = local_78;
      break;
    case 7:
      QVar7 = bindableFilterRole(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_90 = QVar7.super_QUntypedBindable.data;
      *puVar2 = local_90;
      local_88 = QVar7.super_QUntypedBindable.iface;
      puVar2[1] = local_88;
      break;
    case 8:
      QVar8 = bindableRecursiveFilteringEnabled(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_a0 = QVar8.super_QUntypedBindable.data;
      *puVar2 = local_a0;
      local_98 = QVar8.super_QUntypedBindable.iface;
      puVar2[1] = local_98;
      break;
    case 9:
      QVar8 = bindableAutoAcceptChildRows(in_stack_fffffffffffffe88);
      puVar2 = *(undefined8 **)in_RCX;
      local_b0 = QVar8.super_QUntypedBindable.data;
      *puVar2 = local_b0;
      local_a8 = QVar8.super_QUntypedBindable.iface;
      puVar2[1] = local_a8;
    }
  }
switchD_0087b361_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSortFilterProxyModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dynamicSortFilterChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->filterCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 2: _t->sortCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 3: _t->sortLocaleAwareChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->sortRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->filterRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->recursiveFilteringEnabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->autoAcceptChildRowsChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QRegularExpression>>(_a[1]))); break;
        case 10: _t->setFilterWildcard((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->setFilterFixedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->invalidate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::dynamicSortFilterChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::filterCaseSensitivityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::sortCaseSensitivityChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::sortLocaleAwareChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::sortRoleChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::filterRoleChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::recursiveFilteringEnabledChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::autoAcceptChildRowsChanged, 7))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QRegularExpression*>(_v) = _t->filterRegularExpression(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->filterKeyColumn(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->dynamicSortFilter(); break;
        case 3: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->filterCaseSensitivity(); break;
        case 4: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->sortCaseSensitivity(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortLocaleAware(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->sortRole(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->filterRole(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isRecursiveFilteringEnabled(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->autoAcceptChildRows(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilterRegularExpression(*reinterpret_cast<QRegularExpression*>(_v)); break;
        case 1: _t->setFilterKeyColumn(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setDynamicSortFilter(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setFilterCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 4: _t->setSortCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 5: _t->setSortLocaleAware(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setSortRole(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setFilterRole(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setRecursiveFilteringEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setAutoAcceptChildRows(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRegularExpression(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterKeyColumn(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDynamicSortFilter(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterCaseSensitivity(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortCaseSensitivity(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableIsSortLocaleAware(); break;
        case 6: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortRole(); break;
        case 7: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRole(); break;
        case 8: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableRecursiveFilteringEnabled(); break;
        case 9: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableAutoAcceptChildRows(); break;
        default: break;
        }
    }
}